

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O1

char * stbi_zlib_decode_malloc_guesssize(char *buffer,int len,int initial_size,int *outlen)

{
  int iVar1;
  char *obuf;
  zbuf a;
  zbuf local_1020;
  
  obuf = (char *)malloc((long)initial_size);
  if (obuf != (char *)0x0) {
    local_1020.zbuffer_end = (uint8 *)(buffer + len);
    local_1020.zbuffer = (uint8 *)buffer;
    iVar1 = do_zlib(&local_1020,obuf,initial_size,1,1);
    if (iVar1 != 0) {
      if (outlen != (int *)0x0) {
        *outlen = (int)local_1020.zout - (int)local_1020.zout_start;
      }
      return (char *)CONCAT44(local_1020.zout_start._4_4_,(int)local_1020.zout_start);
    }
    free((void *)CONCAT44(local_1020.zout_start._4_4_,(int)local_1020.zout_start));
  }
  return (char *)0x0;
}

Assistant:

char *stbi_zlib_decode_malloc_guesssize(const char *buffer, int len, int initial_size, int *outlen)
{
   zbuf a;
   char *p = (char *) malloc(initial_size);
   if (p == NULL) return NULL;
   a.zbuffer = (uint8 *) buffer;
   a.zbuffer_end = (uint8 *) buffer + len;
   if (do_zlib(&a, p, initial_size, 1, 1)) {
      if (outlen) *outlen = (int) (a.zout - a.zout_start);
      return a.zout_start;
   } else {
      free(a.zout_start);
      return NULL;
   }
}